

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O2

void __thiscall fasttext::Autotune::startTimer(Autotune *this,Args *args)

{
  __sighandler_t p_Var1;
  pointer *__ptr;
  __sighandler_t previousSignalHandler;
  thread local_1d0;
  _Any_data local_1c8;
  Args local_1b8;
  
  local_1c8._8_8_ = std::chrono::_V2::steady_clock::now();
  local_1c8._M_unused._M_object = this;
  Args::Args(&local_1b8,args);
  local_1d0._M_id._M_thread = (id)0;
  p_Var1 = (__sighandler_t)operator_new(0x1b0);
  *(undefined ***)p_Var1 = &PTR___State_impl_00135628;
  *(void **)(p_Var1 + 8) = local_1c8._M_unused._M_object;
  *(undefined8 *)(p_Var1 + 0x10) = local_1c8._8_8_;
  Args::Args((Args *)(p_Var1 + 0x18),&local_1b8);
  previousSignalHandler = p_Var1;
  std::thread::_M_start_thread(&local_1d0,&previousSignalHandler,0);
  if (previousSignalHandler != (__sighandler_t)0x0) {
    (**(code **)(*(long *)previousSignalHandler + 8))();
  }
  std::thread::operator=(&this->timer_,&local_1d0);
  std::thread::~thread(&local_1d0);
  Args::~Args(&local_1b8);
  this->bestScore_ = -1.0;
  this->trials_ = 0;
  LOCK();
  (this->continueTraining_)._M_base._M_i = true;
  UNLOCK();
  previousSignalHandler = (__sighandler_t)signal(2,anon_unknown.dwarf_3006b::signalHandler);
  local_1b8.manualArgs_._M_h._M_buckets =
       (__buckets_ptr)(anonymous_namespace)::interruptSignalHandler._16_8_;
  local_1c8._M_unused._M_object = (void *)(anonymous_namespace)::interruptSignalHandler._0_8_;
  local_1c8._8_8_ = (anonymous_namespace)::interruptSignalHandler._8_8_;
  (anonymous_namespace)::interruptSignalHandler._16_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/autotune.cc:283:28)>
       ::_M_manager;
  local_1b8.manualArgs_._M_h._M_bucket_count = (anonymous_namespace)::interruptSignalHandler._24_8_;
  (anonymous_namespace)::interruptSignalHandler._24_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/autotune.cc:283:28)>
       ::_M_invoke;
  (anonymous_namespace)::interruptSignalHandler._0_8_ = &previousSignalHandler;
  (anonymous_namespace)::interruptSignalHandler._8_8_ = this;
  std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
  return;
}

Assistant:

void Autotune::startTimer(const Args& args) {
  std::chrono::steady_clock::time_point start =
      std::chrono::steady_clock::now();
  timer_ = std::thread([=]() { timer(start, args.autotuneDuration); });
  bestScore_ = kUnknownBestScore;
  trials_ = 0;
  continueTraining_ = true;

  auto previousSignalHandler = std::signal(SIGINT, signalHandler);
  interruptSignalHandler = [&]() {
    std::signal(SIGINT, previousSignalHandler);
    std::cerr << std::endl << "Aborting autotune..." << std::endl;
    abort();
  };
}